

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::StringPtr&,char,kj::StringPtr_const&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,char *params_1,
          StringPtr *params_2)

{
  undefined1 local_29 [9];
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_18 = *(undefined8 *)this;
  local_10 = *(long *)(this + 8) + -1;
  local_29[0] = *(undefined1 *)&(params->content).ptr;
  local_29._1_8_ = *(undefined8 *)params_1;
  local_20 = *(long *)(params_1 + 8) + -1;
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,(ArrayPtr<const_char> *)local_29,
             (FixedArray<char,_1UL> *)(local_29 + 1),&params_2->content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}